

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

void zsat_solver_restart_seed(sat_solver *s,double seed)

{
  int iVar1;
  clause *pcVar2;
  int local_1c;
  int i;
  double seed_local;
  sat_solver *s_local;
  
  Sat_MemRestart(&s->Mem);
  s->hLearnts = -1;
  iVar1 = Sat_MemAppend(&s->Mem,(int *)0x0,2,0,0);
  s->hBinary = iVar1;
  pcVar2 = clause_read(s,s->hBinary);
  s->binary = pcVar2;
  veci_resize(&s->trail_lim,0);
  veci_resize(&s->order,0);
  for (local_1c = 0; SBORROW4(local_1c,s->size * 2) != local_1c + s->size * -2 < 0;
      local_1c = local_1c + 1) {
    s->wlists[local_1c].size = 0;
  }
  s->nDBreduces = 0;
  s->size = 0;
  s->qhead = 0;
  s->qtail = 0;
  solver_init_activities(s);
  veci_resize(&s->act_clas,0);
  s->root_level = 0;
  s->random_seed = seed;
  s->progress_estimate = 0.0;
  s->verbosity = 0;
  (s->stats).starts = 0;
  (s->stats).decisions = 0;
  (s->stats).propagations = 0;
  (s->stats).inspects = 0;
  (s->stats).conflicts = 0;
  (s->stats).clauses = 0;
  (s->stats).clauses_literals = 0;
  (s->stats).learnts = 0;
  (s->stats).learnts_literals = 0;
  (s->stats).tot_literals = 0;
  return;
}

Assistant:

void zsat_solver_restart_seed( sat_solver* s, double seed )
{
    int i;
    Sat_MemRestart( &s->Mem );
    s->hLearnts = -1;
    s->hBinary = Sat_MemAppend( &s->Mem, NULL, 2, 0, 0 );
    s->binary = clause_read( s, s->hBinary );

    veci_resize(&s->trail_lim, 0);
    veci_resize(&s->order, 0);
    for ( i = 0; i < s->size*2; i++ )
        s->wlists[i].size = 0;

    s->nDBreduces = 0;

    // initialize other vars
    s->size                   = 0;
//    s->cap                    = 0;
    s->qhead                  = 0;
    s->qtail                  = 0;

    solver_init_activities(s);
    veci_resize(&s->act_clas, 0);

    s->root_level             = 0;
//    s->simpdb_assigns         = 0;
//    s->simpdb_props           = 0;
    s->random_seed            = seed;
    s->progress_estimate      = 0;
    s->verbosity              = 0;

    s->stats.starts           = 0;
    s->stats.decisions        = 0;
    s->stats.propagations     = 0;
    s->stats.inspects         = 0;
    s->stats.conflicts        = 0;
    s->stats.clauses          = 0;
    s->stats.clauses_literals = 0;
    s->stats.learnts          = 0;
    s->stats.learnts_literals = 0;
    s->stats.tot_literals     = 0;
}